

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O0

void google::protobuf::compiler::cpp::anon_unknown_9::CollectMacroNames
               (Descriptor *message,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *names)

{
  bool bVar1;
  int iVar2;
  FieldDescriptor *this;
  string *psVar3;
  Descriptor *message_00;
  int local_2c;
  int i_1;
  FieldDescriptor *field;
  int i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *names_local;
  Descriptor *message_local;
  
  for (field._4_4_ = 0; iVar2 = Descriptor::field_count(message), field._4_4_ < iVar2;
      field._4_4_ = field._4_4_ + 1) {
    this = Descriptor::field(message,field._4_4_);
    psVar3 = FieldDescriptor::name_abi_cxx11_(this);
    bVar1 = IsMacroName(psVar3);
    if (bVar1) {
      psVar3 = FieldDescriptor::name_abi_cxx11_(this);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(names,psVar3);
    }
  }
  for (local_2c = 0; iVar2 = Descriptor::nested_type_count(message), local_2c < iVar2;
      local_2c = local_2c + 1) {
    message_00 = Descriptor::nested_type(message,local_2c);
    CollectMacroNames(message_00,names);
  }
  return;
}

Assistant:

void CollectMacroNames(const Descriptor* message, std::vector<string>* names) {
  for (int i = 0; i < message->field_count(); ++i) {
    const FieldDescriptor* field = message->field(i);
    if (IsMacroName(field->name())) {
      names->push_back(field->name());
    }
  }
  for (int i = 0; i < message->nested_type_count(); ++i) {
    CollectMacroNames(message->nested_type(i), names);
  }
}